

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O3

bool spvtools::val::anon_unknown_0::checkForRequiredDecoration
               (uint32_t struct_id,function<bool_(spv::Decoration)> *checker,Op type,
               ValidationState_t *vstate)

{
  _Manager_type p_Var1;
  bool bVar2;
  uint32_t uVar3;
  Instruction *pIVar4;
  mapped_type *pmVar5;
  _Rb_tree_node_base *p_Var6;
  ValidationState_t *vstate_00;
  byte bVar7;
  ValidationState_t *pVVar8;
  uint32_t *puVar9;
  uint32_t *puVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  void *local_78;
  void *pvStack_70;
  long local_68;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type p_Stack_40;
  
  vstate_00 = vstate;
  pIVar4 = ValidationState_t::FindDef(vstate,struct_id);
  local_78 = (void *)0x0;
  pvStack_70 = (void *)0x0;
  local_68 = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  _M_range_initialize<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,
             (pIVar4->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start + 2,
             (pIVar4->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  if (pvStack_70 != local_78) {
    pVVar8 = (ValidationState_t *)0x0;
    do {
      uVar3 = *(uint32_t *)((long)local_78 + (long)pVVar8 * 4);
      if (type == OpTypeMatrix) {
        while (pIVar4 = ValidationState_t::FindDef(vstate,uVar3),
              ((pIVar4->inst_).opcode & 0xfffe) == 0x1c) {
          uVar3 = Instruction::GetOperandAs<unsigned_int>(pIVar4,1);
        }
        uVar3 = (pIVar4->inst_).result_id;
      }
      pIVar4 = ValidationState_t::FindDef(vstate,uVar3);
      if ((pIVar4->inst_).opcode == type) {
        local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = uVar3;
        pmVar5 = std::
                 map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                 ::operator[](&vstate->id_decorations_,(key_type_conflict *)&local_90);
        bVar7 = 0;
        for (p_Var6 = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &(pmVar5->_M_t)._M_impl.super__Rb_tree_header;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = p_Var6[1]._M_color;
          if ((checker->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_002cb645;
          bVar2 = (*checker->_M_invoker)((_Any_data *)checker,(Decoration *)&local_90);
          bVar7 = bVar7 | bVar2;
        }
        local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = struct_id;
        pmVar5 = std::
                 map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                 ::operator[](&vstate->id_decorations_,(key_type_conflict *)&local_90);
        for (p_Var6 = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &(pmVar5->_M_t)._M_impl.super__Rb_tree_header;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = p_Var6[1]._M_color;
          if ((checker->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_002cb645:
            std::__throw_bad_function_call();
          }
          bVar2 = (*checker->_M_invoker)((_Any_data *)checker,(Decoration *)&local_90);
          if (bVar2) {
            bVar7 = bVar7 | p_Var6[2]._M_color == (_Rb_tree_color)pVVar8;
          }
        }
        if (bVar7 == 0) {
          bVar2 = false;
          goto LAB_002cb61c;
        }
      }
      pVVar8 = (ValidationState_t *)((long)&pVVar8->context_ + 1);
      vstate_00 = (ValidationState_t *)((long)pvStack_70 - (long)local_78 >> 2);
    } while (pVVar8 < vstate_00);
  }
  getStructMembers(&local_90,struct_id,(Op)vstate,vstate_00);
  puVar10 = (uint32_t *)
            CONCAT44(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                     (_Rb_tree_color)
                     local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  if (puVar10 ==
      local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar2 = true;
  }
  else {
    do {
      puVar9 = puVar10 + 1;
      uVar3 = *puVar10;
      local_48 = (_Manager_type)0x0;
      p_Stack_40 = (_Invoker_type)0x0;
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      p_Var1 = (checker->super__Function_base)._M_manager;
      if (p_Var1 != (_Manager_type)0x0) {
        (*p_Var1)(&local_58,(_Any_data *)checker,__clone_functor);
        local_48 = (checker->super__Function_base)._M_manager;
        p_Stack_40 = checker->_M_invoker;
      }
      bVar2 = checkForRequiredDecoration
                        (uVar3,(function<bool_(spv::Decoration)> *)&local_58,type,vstate);
      if (local_48 != (_Manager_type)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      puVar10 = puVar9;
    } while (bVar2 && puVar9 != local_90.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish);
    puVar10 = (uint32_t *)
              CONCAT44(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                       (_Rb_tree_color)
                       local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start);
  }
  if (puVar10 != (uint32_t *)0x0) {
    operator_delete(puVar10,(long)local_90.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar10)
    ;
  }
LAB_002cb61c:
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  return bVar2;
}

Assistant:

bool checkForRequiredDecoration(uint32_t struct_id,
                                std::function<bool(spv::Decoration)> checker,
                                spv::Op type, ValidationState_t& vstate) {
  const auto& members = getStructMembers(struct_id, vstate);
  for (size_t memberIdx = 0; memberIdx < members.size(); memberIdx++) {
    auto id = members[memberIdx];
    if (type == spv::Op::OpTypeMatrix) {
      // Matrix decorations also apply to arrays of matrices.
      auto memberInst = vstate.FindDef(id);
      while (memberInst->opcode() == spv::Op::OpTypeArray ||
             memberInst->opcode() == spv::Op::OpTypeRuntimeArray) {
        memberInst = vstate.FindDef(memberInst->GetOperandAs<uint32_t>(1u));
      }
      id = memberInst->id();
    }
    if (type != vstate.FindDef(id)->opcode()) continue;
    bool found = false;
    for (auto& dec : vstate.id_decorations(id)) {
      if (checker(dec.dec_type())) found = true;
    }
    for (auto& dec : vstate.id_decorations(struct_id)) {
      if (checker(dec.dec_type()) &&
          (int)memberIdx == dec.struct_member_index()) {
        found = true;
      }
    }
    if (!found) {
      return false;
    }
  }
  for (auto id : getStructMembers(struct_id, spv::Op::OpTypeStruct, vstate)) {
    if (!checkForRequiredDecoration(id, checker, type, vstate)) {
      return false;
    }
  }
  return true;
}